

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O2

ostream * setup::operator<<(ostream *os,version *version)

{
  bool bVar1;
  uint16_t uVar2;
  ostream *poVar3;
  
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar3 = std::operator<<(poVar3,'.');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,'.');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if ((char)version->value != '\0') {
    poVar3 = std::operator<<(os,'.');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  bVar1 = setup::version::is_unicode(version);
  if (bVar1) {
    std::operator<<(os," (unicode)");
  }
  uVar2 = setup::version::bits(version);
  if (uVar2 != 0x20) {
    poVar3 = std::operator<<(os," (");
    uVar2 = setup::version::bits(version);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)uVar2);
    std::operator<<(poVar3,"-bit)");
  }
  bVar1 = setup::version::is_isx(version);
  if (bVar1) {
    std::operator<<(os," (isx)");
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const version & version) {
	
	os << version.a() << '.' << version.b() << '.' << version.c();
	if(version.d()) {
		os << '.' << version.d();
	}
	
	if(version.is_unicode()) {
		os << " (unicode)";
	}
	
	if(version.bits() != 32) {
		os << " (" << int(version.bits()) << "-bit)";
	}
	
	if(version.is_isx()) {
		os << " (isx)";
	}
	
	return os;
}